

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_Init(ARKodeMem ark_mem,int init_type)

{
  int iVar1;
  int iVar2;
  N_Vector_Ops p_Var3;
  void *pvVar4;
  int in_ESI;
  ARKodeMem in_RDI;
  int j;
  int retval;
  ARKodeERKStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffdc;
  N_Vector in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = erkStep_AccessStepMem
                    ((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                     (char *)in_stack_ffffffffffffffe0,
                     (ARKodeERKStepMem *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (iVar1 == 0) {
    if ((in_ESI == 2) || (in_ESI == 1)) {
      iVar1 = 0;
    }
    else {
      if ((in_RDI->fixedstep != 0) && (in_RDI->user_efun == 0)) {
        in_RDI->user_efun = 0;
        in_RDI->efun = arkEwtSetSmallReal;
        in_RDI->e_data = in_RDI;
      }
      iVar1 = erkStep_SetButcherTable
                        ((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar1 == 0) {
        iVar1 = erkStep_CheckButcherTable
                          ((ARKodeMem)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
        ;
        if (iVar1 == 0) {
          iVar5 = *(int *)&(in_stack_ffffffffffffffe0[1].ops)->nvgetvectorid;
          in_RDI->hadapt_mem->q = iVar5;
          *(int *)&in_stack_ffffffffffffffe0->sunctx = iVar5;
          iVar5 = *(int *)((long)&(in_stack_ffffffffffffffe0[1].ops)->nvgetvectorid + 4);
          in_RDI->hadapt_mem->p = iVar5;
          *(int *)((long)&in_stack_ffffffffffffffe0->sunctx + 4) = iVar5;
          if ((in_RDI->fixedstep == 0) &&
             (*(int *)((long)&in_stack_ffffffffffffffe0->sunctx + 4) == 0)) {
            arkProcessError(in_RDI,-0x16,0x1a3,"erkStep_Init",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                            ,
                            "Adaptive timestepping cannot be performed without embedding coefficients"
                           );
            iVar1 = -0x16;
          }
          else {
            if (in_stack_ffffffffffffffe0->ops == (N_Vector_Ops)0x0) {
              p_Var3 = (N_Vector_Ops)calloc((long)*(int *)&in_stack_ffffffffffffffe0[1].content,8);
              in_stack_ffffffffffffffe0->ops = p_Var3;
            }
            for (iVar5 = 0; iVar5 < *(int *)&in_stack_ffffffffffffffe0[1].content; iVar5 = iVar5 + 1
                ) {
              iVar2 = arkAllocVec((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                  in_stack_ffffffffffffffe0,(N_Vector *)CONCAT44(iVar1,iVar5));
              if (iVar2 == 0) {
                return -0x14;
              }
            }
            in_RDI->liw = (long)*(int *)&in_stack_ffffffffffffffe0[1].content + in_RDI->liw;
            if (in_stack_ffffffffffffffe0[2].content == (void *)0x0) {
              pvVar4 = calloc((long)(*(int *)&in_stack_ffffffffffffffe0[1].content + 1),8);
              in_stack_ffffffffffffffe0[2].content = pvVar4;
              if (in_stack_ffffffffffffffe0[2].content == (void *)0x0) {
                return -0x14;
              }
              in_RDI->lrw = (long)(*(int *)&in_stack_ffffffffffffffe0[1].content + 1) + in_RDI->lrw;
            }
            if (in_stack_ffffffffffffffe0[2].ops == (N_Vector_Ops)0x0) {
              p_Var3 = (N_Vector_Ops)
                       calloc((long)(*(int *)&in_stack_ffffffffffffffe0[1].content + 1),8);
              in_stack_ffffffffffffffe0[2].ops = p_Var3;
              if (in_stack_ffffffffffffffe0[2].ops == (N_Vector_Ops)0x0) {
                return -0x14;
              }
              in_RDI->liw = (long)(*(int *)&in_stack_ffffffffffffffe0[1].content + 1) + in_RDI->liw;
            }
            if ((*(int *)&in_stack_ffffffffffffffe0->sunctx < 2) ||
               (in_RDI->interp_degree <= *(int *)&in_stack_ffffffffffffffe0->sunctx + -1)) {
              if ((*(int *)&in_stack_ffffffffffffffe0->sunctx == 1) && (1 < in_RDI->interp_degree))
              {
                in_RDI->interp_degree = 1;
              }
            }
            else {
              in_RDI->interp_degree = *(int *)&in_stack_ffffffffffffffe0->sunctx + -1;
            }
            in_RDI->call_fullrhs = 1;
            iVar1 = 0;
          }
        }
        else {
          arkProcessError(in_RDI,-0x16,0x197,"erkStep_Init",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                          ,"Error in Butcher table");
          iVar1 = -0x16;
        }
      }
      else {
        arkProcessError(in_RDI,-0x16,0x18e,"erkStep_Init",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                        ,"Could not create Butcher table");
        iVar1 = -0x16;
      }
    }
  }
  return iVar1;
}

Assistant:

int erkStep_Init(ARKodeMem ark_mem, int init_type)
{
  ARKodeERKStepMem step_mem;
  int retval, j;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* immediately return if resize or reset */
  if (init_type == RESIZE_INIT || init_type == RESET_INIT)
  {
    return (ARK_SUCCESS);
  }

  /* enforce use of arkEwtSmallReal if using a fixed step size
     and an internal error weight function */
  if (ark_mem->fixedstep && !ark_mem->user_efun)
  {
    ark_mem->user_efun = SUNFALSE;
    ark_mem->efun      = arkEwtSetSmallReal;
    ark_mem->e_data    = ark_mem;
  }

  /* Create Butcher table (if not already set) */
  retval = erkStep_SetButcherTable(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Could not create Butcher table");
    return (ARK_ILL_INPUT);
  }

  /* Check that Butcher table are OK */
  retval = erkStep_CheckButcherTable(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Error in Butcher table");
    return (ARK_ILL_INPUT);
  }

  /* Retrieve/store method and embedding orders now that table is finalized */
  step_mem->q = ark_mem->hadapt_mem->q = step_mem->B->q;
  step_mem->p = ark_mem->hadapt_mem->p = step_mem->B->p;

  /* Ensure that if adaptivity is enabled, then method includes embedding coefficients */
  if (!ark_mem->fixedstep && (step_mem->p == 0))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Adaptive timestepping cannot be performed without embedding coefficients");
    return (ARK_ILL_INPUT);
  }

  /* Allocate ARK RHS vector memory, update storage requirements */
  /*   Allocate F[0] ... F[stages-1] if needed */
  if (step_mem->F == NULL)
  {
    step_mem->F = (N_Vector*)calloc(step_mem->stages, sizeof(N_Vector));
  }
  for (j = 0; j < step_mem->stages; j++)
  {
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->F[j])))
    {
      return (ARK_MEM_FAIL);
    }
  }
  ark_mem->liw += step_mem->stages; /* pointers */

  /* Allocate reusable arrays for fused vector interface */
  if (step_mem->cvals == NULL)
  {
    step_mem->cvals = (sunrealtype*)calloc(step_mem->stages + 1,
                                           sizeof(sunrealtype));
    if (step_mem->cvals == NULL) { return (ARK_MEM_FAIL); }
    ark_mem->lrw += (step_mem->stages + 1);
  }
  if (step_mem->Xvecs == NULL)
  {
    step_mem->Xvecs = (N_Vector*)calloc(step_mem->stages + 1, sizeof(N_Vector));
    if (step_mem->Xvecs == NULL) { return (ARK_MEM_FAIL); }
    ark_mem->liw += (step_mem->stages + 1); /* pointers */
  }

  /* Override the interpolant degree (if needed), used in arkInitialSetup */
  if (step_mem->q > 1 && ark_mem->interp_degree > (step_mem->q - 1))
  {
    /* Limit max degree to at most one less than the method global order */
    ark_mem->interp_degree = step_mem->q - 1;
  }
  else if (step_mem->q == 1 && ark_mem->interp_degree > 1)
  {
    /* Allow for linear interpolant with first order methods to ensure
       solution values are returned at the time interval end points */
    ark_mem->interp_degree = 1;
  }

  /* Signal to shared arkode module that full RHS evaluations are required */
  ark_mem->call_fullrhs = SUNTRUE;

  return (ARK_SUCCESS);
}